

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

void close_socket(uv_os_sock_t sock)

{
  uv_poll_t *handle;
  int iVar1;
  int *piVar2;
  uint uVar3;
  undefined4 in_register_0000003c;
  uv_handle_t *handle_00;
  long *plVar4;
  code **ppcVar5;
  code *pcStack_28;
  undefined8 uStack_20;
  long lStack_18;
  
  handle_00 = (uv_handle_t *)CONCAT44(in_register_0000003c,sock);
  iVar1 = close(sock);
  if (iVar1 == 0) {
    return;
  }
  piVar2 = __errno_location();
  if (*piVar2 == 0x68) {
    return;
  }
  close_socket_cold_1();
  handle = (uv_poll_t *)handle_00->data;
  pcStack_28 = (code *)0x1b30e0;
  iVar1 = uv_is_active(handle_00);
  lStack_18 = (long)iVar1;
  uStack_20 = 0;
  if (lStack_18 == 0) {
    uVar3 = *(uint *)&handle[2].handle_queue.prev;
    if (uVar3 == 0) goto LAB_001b3156;
    uVar3 = uVar3 | *(uint *)((long)&handle[2].handle_queue.next + 4);
    *(uint *)((long)&handle[2].handle_queue.next + 4) = uVar3;
    *(undefined4 *)&handle[2].handle_queue.prev = 0;
    pcStack_28 = (code *)0x1b3129;
    iVar1 = uv_poll_start(handle,uVar3,connection_poll_cb);
    lStack_18 = (long)iVar1;
    uStack_20 = 0;
    if (lStack_18 == 0) {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x1b3156;
    delay_timer_cb_cold_1();
LAB_001b3156:
    pcStack_28 = (code *)0x1b315b;
    delay_timer_cb_cold_3();
  }
  plVar4 = &lStack_18;
  pcStack_28 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar5 = (code **)*plVar4;
  piVar2 = (int *)((long)ppcVar5 + 0x114);
  *piVar2 = *piVar2 + -1;
  if (*piVar2 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    if (*(int *)(ppcVar5 + 0x22) != 0) {
      pcStack_28 = ppcVar5[0x20];
      if (pcStack_28 == (code *)0x10000) {
        pcStack_28 = ppcVar5[0x21];
        if (pcStack_28 == (code *)0x0) goto LAB_001b3259;
        ppcVar5 = &pcStack_28;
        connection_close_cb_cold_2();
        goto LAB_001b31e7;
      }
      goto LAB_001b3208;
    }
LAB_001b3217:
    pcStack_28 = ppcVar5[0x20];
    if (pcStack_28 != (code *)0x0) goto LAB_001b3277;
  }
  else {
LAB_001b31e7:
    pcStack_28 = ppcVar5[0x20];
    if (pcStack_28 != (code *)0x10000) {
LAB_001b3208:
      ppcVar5 = &pcStack_28;
      connection_close_cb_cold_1();
      goto LAB_001b3217;
    }
  }
  pcStack_28 = ppcVar5[0x21];
  if (pcStack_28 == (code *)0x10000) {
LAB_001b3259:
    closed_connections = closed_connections + 1;
    free(ppcVar5);
    return;
  }
  connection_close_cb_cold_4();
LAB_001b3277:
  ppcVar5 = &pcStack_28;
  connection_close_cb_cold_3();
  free(*ppcVar5);
  return;
}

Assistant:

static void close_socket(uv_os_sock_t sock) {
  int r;
#ifdef _WIN32
  r = closesocket(sock);
#else
  r = close(sock);
#endif
  /* On FreeBSD close() can fail with ECONNRESET if the socket was shutdown by
   * the peer before all pending data was delivered.
   */
  ASSERT(r == 0 || errno == ECONNRESET);
}